

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::internal::StrCaseNeHelper::Assertion<wchar_t_const*,wchar_t_const*>
          (AssertionResult *__return_storage_ptr__,StrCaseNeHelper *this,char *expr1,char *expr2,
          wchar_t **val1,wchar_t **val2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  wchar_t **v;
  wchar_t **v_00;
  char *local_d8;
  StrCaseNeHelper *local_d0;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  AssertionResult local_48;
  
  local_d8 = expr1;
  local_d0 = this;
  bVar1 = Compare<wchar_t_const*,wchar_t_const*>((wchar_t **)expr2,val1);
  if (bVar1) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    local_48.m_message._M_dataplus._M_p = (pointer)&local_48.m_message.field_2;
    local_48.m_message._M_string_length = 0;
    local_48.m_message.field_2._M_local_buf[0] = '\0';
    local_48.m_result = false;
    pAVar2 = AssertionResult::operator<<(&local_48,(char (*) [18])"error: Expected: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&local_d0);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" != ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_d8);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [17])" (ignoring case)");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])0x314e7d);
    PrintToString<wchar_t_const*>(&local_88,(iutest *)val1,v);
    detail::ShowStringQuoted(&local_68,&local_88);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_68);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
    PrintToString<wchar_t_const*>(&local_c8,(iutest *)expr2,v_00);
    detail::ShowStringQuoted(&local_a8,&local_c8);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_a8);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult IUTEST_ATTRIBUTE_UNUSED_ Assertion(
    const char* expr1, const char* expr2
        , const T1& val1, const T2& val2)
{
    if IUTEST_COND_LIKELY( Compare(val1, val2) )
    {
        return AssertionSuccess();
    }

    return AssertionFailure() << "error: Expected: " << expr1 << " != " << expr2 << " (ignoring case)"
        << "\n  Actual: " << detail::ShowStringQuoted(FormatForComparisonFailureMessage(val2, val1))
        << " vs " << detail::ShowStringQuoted(FormatForComparisonFailureMessage(val1, val2));
}